

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

S2Polyline * __thiscall S2Polyline::operator=(S2Polyline *this,S2Polyline *other)

{
  int iVar1;
  int local_1c;
  S2Polyline *local_18;
  S2Polyline *other_local;
  S2Polyline *this_local;
  
  this->s2debug_override_ = other->s2debug_override_;
  local_1c = 0;
  local_18 = other;
  other_local = this;
  iVar1 = absl::exchange<int,int>(&other->num_vertices_,&local_1c);
  this->num_vertices_ = iVar1;
  std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator=
            (&this->vertices_,&local_18->vertices_);
  return this;
}

Assistant:

S2Polyline& S2Polyline::operator=(S2Polyline&& other) {
  s2debug_override_ = other.s2debug_override_;
  num_vertices_ = absl::exchange(other.num_vertices_, 0);
  vertices_ = std::move(other.vertices_);
  return *this;
}